

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O1

void __thiscall TPZPrInteg<TPZInt1Point>::GetOrder(TPZPrInteg<TPZInt1Point> *this,TPZVec<int> *ord)

{
  if (0 < ord->fNElements) {
    *ord->fStore = this->fOrdKsi;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n"
             ,0x54);
  return;
}

Assistant:

void GetOrder(TPZVec<int> &ord) const override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::GetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::GetOrder(ord);
		ord[Dim-1] = fOrdKsi;
    }